

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O0

int encode_binary(AMQPVALUE_ENCODER_OUTPUT encoder_output,void *context,uchar *value,uint32_t length
                 )

{
  int iVar1;
  LOGGER_LOG p_Var2;
  LOGGER_LOG l;
  _Bool use_smallest;
  int result;
  uint32_t length_local;
  uchar *value_local;
  void *context_local;
  AMQPVALUE_ENCODER_OUTPUT encoder_output_local;
  
  iVar1 = encode_binary_constructor(encoder_output,context,length < 0x100);
  if ((iVar1 == 0) &&
     (iVar1 = encode_binary_value(encoder_output,context,value,length,length < 0x100), iVar1 == 0))
  {
    return 0;
  }
  p_Var2 = xlogging_get_log_function();
  if (p_Var2 != (LOGGER_LOG)0x0) {
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/amqpvalue.c"
              ,"encode_binary",0xd9a,1,"Failed encoding binary");
  }
  return 0xd9b;
}

Assistant:

static int encode_binary(AMQPVALUE_ENCODER_OUTPUT encoder_output, void* context, const unsigned char* value, uint32_t length)
{
    int result;
    bool use_smallest = (length <= 255);

    if ((encode_binary_constructor(encoder_output, context, use_smallest) != 0) ||
        (encode_binary_value(encoder_output, context, value, length, use_smallest) != 0))
    {
        /* Codes_SRS_AMQPVALUE_01_274: [When the encoder output function fails, amqpvalue_encode shall fail and return a non-zero value.] */
        LogError("Failed encoding binary");
        result = MU_FAILURE;
    }
    else
    {
        /* Codes_SRS_AMQPVALUE_01_266: [On success amqpvalue_encode shall return 0.] */
        result = 0;
    }

    return result;
}